

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::prepareDescriptors(ImageStoreTestInstance *this)

{
  VkFormat VVar1;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  VkDevice pVVar2;
  VkDevice pVVar3;
  ImageType IVar4;
  VkImageViewType VVar5;
  DescriptorSetLayoutBuilder *pDVar6;
  DescriptorPoolBuilder *pDVar7;
  Handle<(vk::HandleType)21> *pHVar8;
  Handle<(vk::HandleType)19> *pHVar9;
  reference pvVar10;
  Image *pIVar11;
  VkImage *pVVar12;
  reference pvVar13;
  VkImageSubresourceRange local_248;
  VkImage local_230;
  Move<vk::Handle<(vk::HandleType)13>_> local_228;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_208;
  deUint64 local_1f8;
  VkDescriptorPool local_1f0;
  Move<vk::Handle<(vk::HandleType)22>_> local_1e8;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_1c8;
  VkImageSubresourceRange local_1b8;
  VkImage local_1a0;
  Move<vk::Handle<(vk::HandleType)13>_> local_198;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_178;
  deUint64 local_168;
  VkDescriptorPool local_160;
  Move<vk::Handle<(vk::HandleType)22>_> local_158;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_138;
  deUint32 local_124;
  undefined1 local_120 [4];
  int layerNdx;
  Move<vk::Handle<(vk::HandleType)21>_> local_108;
  RefData<vk::Handle<(vk::HandleType)21>_> local_e8;
  DescriptorSetLayoutBuilder local_b8;
  Move<vk::Handle<(vk::HandleType)19>_> local_70;
  RefData<vk::Handle<(vk::HandleType)19>_> local_50;
  deUint32 local_2c;
  VkDevice pVStack_28;
  int numLayers;
  VkDevice device;
  DeviceInterface *vk;
  ImageStoreTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  pVStack_28 = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                                  super_TestInstance.m_context);
  local_2c = Texture::numLayers(&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b8);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_b8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar6,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_70,pDVar6,(DeviceInterface *)device,pVStack_28,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_70);
  data.deleter.m_deviceIface = local_50.deleter.m_deviceIface;
  data.object.m_internal = local_50.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_50.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_50.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_70);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_b8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_120);
  pDVar7 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)local_120,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,local_2c);
  pDVar7 = ::vk::DescriptorPoolBuilder::addType(pDVar7,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,local_2c);
  ::vk::DescriptorPoolBuilder::build
            (&local_108,pDVar7,(DeviceInterface *)device,pVStack_28,1,local_2c);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_108);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder((DescriptorPoolBuilder *)local_120);
  pVVar3 = device;
  pVVar2 = pVStack_28;
  if (((this->super_StoreTestInstance).super_BaseTestInstance.m_singleLayerBind & 1U) == 0) {
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                       (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    local_1f0.m_internal = pHVar8->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_descriptorSetLayout).
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    local_1f8 = pHVar9->m_internal;
    makeDescriptorSet(&local_1e8,(DeviceInterface *)pVVar3,pVVar2,local_1f0,
                      (VkDescriptorSetLayout)local_1f8);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>((image *)&local_1c8,&local_1e8);
    pvVar10 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[](&this->m_allDescriptorSets,0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              (pvVar10,&local_1c8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr(&local_1c8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_1e8);
    pVVar3 = device;
    pVVar2 = pVStack_28;
    pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
              operator->(&(this->m_image).
                          super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                        );
    pVVar12 = image::Image::get(pIVar11);
    local_230.m_internal = pVVar12->m_internal;
    IVar4 = Texture::type(&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture);
    VVar5 = mapImageViewType(IVar4);
    VVar1 = (this->super_StoreTestInstance).super_BaseTestInstance.m_format;
    ::vk::makeImageSubresourceRange(&local_248,1,0,1,0,local_2c);
    subresourceRange_00.levelCount = local_248.levelCount;
    subresourceRange_00.baseArrayLayer = local_248.baseArrayLayer;
    subresourceRange_00.aspectMask = local_248.aspectMask;
    subresourceRange_00.baseMipLevel = local_248.baseMipLevel;
    subresourceRange_00.layerCount = local_248.layerCount;
    makeImageView(&local_228,(DeviceInterface *)pVVar3,pVVar2,local_230,VVar5,VVar1,
                  subresourceRange_00);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((image *)&local_208,&local_228);
    pvVar13 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&this->m_allImageViews,0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar13,&local_208);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_208);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_228);
  }
  else {
    for (local_124 = 0; pVVar3 = device, pVVar2 = pVStack_28, (int)local_124 < (int)local_2c;
        local_124 = local_124 + 1) {
      pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                         (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      local_160.m_internal = pHVar8->m_internal;
      pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                         (&(this->m_descriptorSetLayout).
                           super_RefBase<vk::Handle<(vk::HandleType)19>_>);
      local_168 = pHVar9->m_internal;
      makeDescriptorSet(&local_158,(DeviceInterface *)pVVar3,pVVar2,local_160,
                        (VkDescriptorSetLayout)local_168);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>((image *)&local_138,&local_158);
      pvVar10 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                ::operator[](&this->m_allDescriptorSets,(long)(int)local_124);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                (pvVar10,&local_138);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
                (&local_138);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_158);
      pVVar3 = device;
      pVVar2 = pVStack_28;
      pIVar11 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
                operator->(&(this->m_image).
                            super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                          );
      pVVar12 = image::Image::get(pIVar11);
      local_1a0.m_internal = pVVar12->m_internal;
      IVar4 = Texture::type(&(this->super_StoreTestInstance).super_BaseTestInstance.m_texture);
      IVar4 = getImageTypeForSingleLayer(IVar4);
      VVar5 = mapImageViewType(IVar4);
      VVar1 = (this->super_StoreTestInstance).super_BaseTestInstance.m_format;
      ::vk::makeImageSubresourceRange(&local_1b8,1,0,1,local_124,1);
      subresourceRange.levelCount = local_1b8.levelCount;
      subresourceRange.baseArrayLayer = local_1b8.baseArrayLayer;
      subresourceRange.aspectMask = local_1b8.aspectMask;
      subresourceRange.baseMipLevel = local_1b8.baseMipLevel;
      subresourceRange.layerCount = local_1b8.layerCount;
      makeImageView(&local_198,(DeviceInterface *)pVVar3,pVVar2,local_1a0,VVar5,VVar1,
                    subresourceRange);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((image *)&local_178,&local_198);
      pvVar13 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ::operator[](&this->m_allImageViews,(long)(int)local_124);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                (pvVar13,&local_178);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                (&local_178);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_198);
    }
  }
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  return (VkDescriptorSetLayout)pHVar9->m_internal;
}

Assistant:

VkDescriptorSetLayout ImageStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allImageViews[layerNdx]     = makeVkSharedPtr(makeImageView(
												vk, device, m_image->get(), mapImageViewType(getImageTypeForSingleLayer(m_texture.type())), m_format,
												makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u)));
		}
	}
	else // bind all layers at once
	{
		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allImageViews[0] = makeVkSharedPtr(makeImageView(
								vk, device, m_image->get(), mapImageViewType(m_texture.type()), m_format,
								makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}